

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GED_EnhancedRotaryWingAircraft.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::GED_EnhancedRotaryWingAircraft::Decode
          (GED_EnhancedRotaryWingAircraft *this,KDataStream *stream)

{
  KUINT16 KVar1;
  KException *this_00;
  KDataStream *pKVar2;
  allocator<char> local_39;
  KString local_38;
  KDataStream *local_18;
  KDataStream *stream_local;
  GED_EnhancedRotaryWingAircraft *this_local;
  
  local_18 = stream;
  stream_local = (KDataStream *)this;
  KVar1 = KDataStream::GetBufferSize(stream);
  if (KVar1 < 0x1c) {
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Decode",&local_39);
    KException::KException(this_00,&local_38,2);
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  GED_BasicRotorWingAircraft::Decode(&this->super_GED_BasicRotorWingAircraft,local_18);
  pKVar2 = KDataStream::operator>>(local_18,&(this->super_GED_BasicRotorWingAircraft).field_0x2c);
  pKVar2 = KDataStream::operator>>(pKVar2,&(this->super_GED_BasicRotorWingAircraft).field_0x2d);
  pKVar2 = KDataStream::operator>>(pKVar2,&(this->super_GED_BasicRotorWingAircraft).field_0x2e);
  KDataStream::operator>>(pKVar2,&(this->super_GED_BasicRotorWingAircraft).field_0x2f);
  return;
}

Assistant:

void GED_EnhancedRotaryWingAircraft::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < GED_ENHANCED_ROTARY_WING_AIRCRAFT_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    GED_BasicRotorWingAircraft::Decode( stream );

    stream >> m_ui8SupFuelStatus
           >> m_ui8AirMaintStatus
           >> m_ui8PriAmmun
           >> m_ui8SecAmmun;
}